

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_api_dump.cpp
# Opt level: O1

XrResult ApiDumpLayerXrRequestSceneCaptureFB
                   (XrSession session,XrSceneCaptureRequestInfoFB *info,
                   XrAsyncRequestIdFB *requestId)

{
  long lVar1;
  bool bVar2;
  XrResult XVar3;
  invalid_argument *this;
  _Hash_node_base *p_Var4;
  __node_base_ptr p_Var5;
  __node_base_ptr p_Var6;
  XrGeneratedDispatchTable *gen_dispatch_table;
  __hash_code __code;
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  contents;
  ostringstream oss_requestId;
  ostringstream oss_session;
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_3b8;
  XrGeneratedDispatchTable *local_3a0;
  string local_398;
  string local_378;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_358;
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_338;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_320 [3];
  ios_base local_2b0 [264];
  unique_lock<std::mutex> local_1a8;
  uint auStack_190 [22];
  ios_base local_138 [264];
  
  local_3b8.
  super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_3b8.
  super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_3b8.
  super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1a8._M_device = &g_session_dispatch_mutex;
  local_1a8._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_1a8);
  local_1a8._M_owns = true;
  p_Var5 = g_session_dispatch_map._M_h._M_buckets
           [(ulong)session % g_session_dispatch_map._M_h._M_bucket_count];
  p_Var6 = (__node_base_ptr)0x0;
  if ((p_Var5 != (__node_base_ptr)0x0) &&
     (p_Var4 = p_Var5->_M_nxt, p_Var6 = p_Var5, (XrSession)p_Var5->_M_nxt[1]._M_nxt != session)) {
    while (p_Var5 = p_Var4, p_Var4 = p_Var5->_M_nxt, p_Var4 != (_Hash_node_base *)0x0) {
      p_Var6 = (__node_base_ptr)0x0;
      if (((ulong)p_Var4[1]._M_nxt % g_session_dispatch_map._M_h._M_bucket_count !=
           (ulong)session % g_session_dispatch_map._M_h._M_bucket_count) ||
         (p_Var6 = p_Var5, (XrSession)p_Var4[1]._M_nxt == session)) goto LAB_002508fd;
    }
    p_Var6 = (__node_base_ptr)0x0;
  }
LAB_002508fd:
  if (p_Var6 == (__node_base_ptr)0x0) {
    p_Var4 = (_Hash_node_base *)0x0;
  }
  else {
    p_Var4 = p_Var6->_M_nxt;
  }
  if (p_Var4 == (_Hash_node_base *)0x0) {
    gen_dispatch_table = (XrGeneratedDispatchTable *)0x0;
  }
  else {
    gen_dispatch_table = (XrGeneratedDispatchTable *)p_Var4[2]._M_nxt;
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_1a8);
  if (p_Var4 == (_Hash_node_base *)0x0) {
    XVar3 = XR_ERROR_VALIDATION_FAILURE;
  }
  else {
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[9],char_const(&)[24],char_const(&)[1]>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)&local_3b8,(char (*) [9])"XrResult",(char (*) [24])"xrRequestSceneCaptureFB",
               (char (*) [1])0x2a4b54);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
    lVar1 = *(long *)((long)&local_1a8._M_device[-1].super___mutex_base._M_mutex + 0x10);
    *(uint *)((long)auStack_190 + lVar1) = *(uint *)((long)auStack_190 + lVar1) & 0xffffffb5 | 8;
    std::ostream::_M_insert<void_const*>(&local_1a8);
    std::__cxx11::stringbuf::str();
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[10],char_const(&)[8],std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)&local_3b8,(char (*) [10])"XrSession",(char (*) [8])"session",local_320);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_320[0]._M_dataplus._M_p != &local_320[0].field_2) {
      operator_delete(local_320[0]._M_dataplus._M_p,local_320[0].field_2._M_allocated_capacity + 1);
    }
    local_378._M_dataplus._M_p = (pointer)&local_378.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_378,"info","");
    local_398._M_dataplus._M_p = (pointer)&local_398.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_398,"const XrSceneCaptureRequestInfoFB*","");
    local_3a0 = gen_dispatch_table;
    bVar2 = ApiDumpOutputXrStruct(gen_dispatch_table,info,&local_378,&local_398,true,&local_3b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_398._M_dataplus._M_p != &local_398.field_2) {
      operator_delete(local_398._M_dataplus._M_p,local_398.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_378._M_dataplus._M_p != &local_378.field_2) {
      operator_delete(local_378._M_dataplus._M_p,local_378.field_2._M_allocated_capacity + 1);
    }
    if (!bVar2) {
      this = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument(this,"Invalid Operation");
      __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_320);
    *(uint *)((long)&local_320[0].field_2 + *(long *)(local_320[0]._M_dataplus._M_p + -0x18) + 8) =
         *(uint *)((long)&local_320[0].field_2 +
                  *(long *)(local_320[0]._M_dataplus._M_p + -0x18) + 8) & 0xffffffb5 | 8;
    std::ostream::_M_insert<void_const*>(local_320);
    std::__cxx11::stringbuf::str();
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[20],char_const(&)[10],std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)&local_3b8,(char (*) [20])"XrAsyncRequestIdFB*",(char (*) [10])"requestId",
               &local_358);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_358._M_dataplus._M_p != &local_358.field_2) {
      operator_delete(local_358._M_dataplus._M_p,local_358.field_2._M_allocated_capacity + 1);
    }
    std::
    vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::vector(&local_338,&local_3b8);
    ApiDumpLayerRecordContent(&local_338);
    std::
    vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector(&local_338);
    XVar3 = (*local_3a0->RequestSceneCaptureFB)(session,info,requestId);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_320);
    std::ios_base::~ios_base(local_2b0);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
    std::ios_base::~ios_base(local_138);
  }
  std::
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&local_3b8);
  return XVar3;
}

Assistant:

XRAPI_ATTR XrResult XRAPI_CALL ApiDumpLayerXrRequestSceneCaptureFB(
    XrSession session,
    const XrSceneCaptureRequestInfoFB* info,
    XrAsyncRequestIdFB* requestId) {
    XrResult result = XR_SUCCESS;
    try {
        // Generate output for this command
        std::vector<std::tuple<std::string, std::string, std::string>> contents;
        XrGeneratedDispatchTable *gen_dispatch_table = nullptr;

        {
            std::unique_lock<std::mutex> mlock(g_session_dispatch_mutex);
            auto map_iter = g_session_dispatch_map.find(session);
            if (map_iter == g_session_dispatch_map.end()) {
                return XR_ERROR_VALIDATION_FAILURE;
            }
            gen_dispatch_table = map_iter->second;
        }

        contents.emplace_back("XrResult", "xrRequestSceneCaptureFB", "");
        std::ostringstream oss_session;
        oss_session << std::hex << reinterpret_cast<const void*>(session);
        contents.emplace_back("XrSession", "session", oss_session.str());
        if (!ApiDumpOutputXrStruct(gen_dispatch_table, info, "info", "const XrSceneCaptureRequestInfoFB*", true, contents)) {
            throw std::invalid_argument("Invalid Operation");
        }
        std::ostringstream oss_requestId;
        oss_requestId << std::hex << reinterpret_cast<const void*>(requestId);
        contents.emplace_back("XrAsyncRequestIdFB*", "requestId", oss_requestId.str());
        ApiDumpLayerRecordContent(contents);

        result = gen_dispatch_table->RequestSceneCaptureFB(session, info, requestId);
    } catch (...) {
        return XR_ERROR_VALIDATION_FAILURE;
    }
    return result;
}